

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O2

bool __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::remove_path(RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
              *this,RBPath *path)

{
  ulong *puVar1;
  size_t sVar2;
  ulong *puVar3;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *pFVar4;
  bool bVar5;
  RBStep *pRVar6;
  uint uVar7;
  ulong uVar8;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *pFVar9;
  byte bVar10;
  Contents CVar11;
  Contents k;
  
  puVar1 = (path->path)._M_elems[path->length - 1].node.ptr.val;
  RBPath::move(path,true);
  do {
    bVar5 = RBPath::move(path,false);
  } while (bVar5);
  sVar2 = path->length;
  puVar3 = (path->path)._M_elems[sVar2 - 1].node.ptr.val;
  uVar8 = *puVar3;
  CVar11.unsafe_capptr =
       (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
        *)(uVar8 & 0xfffffffffffffffe);
  *puVar3 = (ulong)((uint)uVar8 & 1) |
            (ulong)((CVar11.unsafe_capptr)->left).unsafe_capptr & 0xfffffffffffffffe;
  pFVar9 = ((CVar11.unsafe_capptr)->right).unsafe_capptr;
  if ((path->path)._M_elems[sVar2 - 1].node.ptr.val != puVar1) {
    if ((*puVar1 & 0xfffffffffffffffe) == 0) {
      bVar5 = false;
    }
    else {
      bVar5 = (bool)(*(byte *)((*puVar1 & 0xfffffffffffffffe) + 8) & 1);
    }
    BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
    ::set_red(CVar11,bVar5);
    ((CVar11.unsafe_capptr)->left).unsafe_capptr =
         (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          *)((ulong)((uint)((CVar11.unsafe_capptr)->left).unsafe_capptr & 1) |
            *(ulong *)(*puVar1 & 0xfffffffffffffffe) & 0xfffffffffffffffe);
    ((CVar11.unsafe_capptr)->right).unsafe_capptr =
         (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          *)((ulong)((uint)((CVar11.unsafe_capptr)->right).unsafe_capptr & 1) |
            *(ulong *)((*puVar1 & 0xfffffffffffffffe) + 8) & 0xfffffffffffffffe);
    *puVar1 = (ulong)((uint)*puVar1 & 1) | (ulong)CVar11.unsafe_capptr;
    RBPath::fixup(path,true);
  }
  if (((ulong)pFVar9 & 1) == 0) {
    while (sVar2 = path->length,
          (RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
           *)(path->path)._M_elems[sVar2 - 1].node.ptr.val != this) {
      k.unsafe_capptr =
           (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            *)(*(path->path)._M_elems[sVar2 - 2].node.ptr.val & 0xfffffffffffffffe);
      bVar5 = (path->path)._M_elems[sVar2 - 1].dir;
      pFVar9 = (&(k.unsafe_capptr)->left)[bVar5].unsafe_capptr;
      CVar11.unsafe_capptr = pFVar9 & 0xfffffffffffffffe;
      uVar7 = (uint)pFVar9;
      if ((CVar11.unsafe_capptr ==
           (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            *)0x0) || (((ulong)((CVar11.unsafe_capptr)->right).unsafe_capptr & 1) == 0)) {
        pRVar6 = (path->path)._M_elems + (sVar2 - 2);
        uVar8 = (ulong)(&(CVar11.unsafe_capptr)->left)[bVar5].unsafe_capptr & 0xfffffffffffffffe;
        if ((uVar8 != 0) && ((*(byte *)(uVar8 + 8) & 1) != 0)) {
          pFVar9 = (&(CVar11.unsafe_capptr)->left)[bVar5 ^ 1U].unsafe_capptr;
          (&(CVar11.unsafe_capptr)->left)[bVar5 ^ 1U].unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)((ulong)((uint)pFVar9 & 1) | (ulong)k.unsafe_capptr);
          (&(k.unsafe_capptr)->left)[bVar5].unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)((ulong)((uint)(&(k.unsafe_capptr)->left)[bVar5].unsafe_capptr & 1) |
                  (ulong)pFVar9 & 0xfffffffffffffffe);
          puVar1 = (pRVar6->node).ptr.val;
          *puVar1 = (ulong)((uint)*puVar1 & 1) | (ulong)CVar11.unsafe_capptr;
          if ((*(ulong *)(uVar8 + 8) & 1) != 0) {
            *(ulong *)(uVar8 + 8) = *(ulong *)(uVar8 + 8) & 0xfffffffffffffffe;
          }
          bVar10 = (byte)*(undefined4 *)&((k.unsafe_capptr)->right).unsafe_capptr;
LAB_00105711:
          BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          ::set_red(CVar11,(bool)(bVar10 & 1));
          pFVar9 = ((k.unsafe_capptr)->right).unsafe_capptr;
          if (((ulong)pFVar9 & 1) == 0) {
            return true;
          }
          ((k.unsafe_capptr)->right).unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)((ulong)pFVar9 & 0xfffffffffffffffe);
          return true;
        }
        bVar10 = bVar5 ^ 1;
        pFVar9 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                  *)((ulong)(&(CVar11.unsafe_capptr)->left)[bVar10].unsafe_capptr &
                    0xfffffffffffffffe);
        if ((pFVar9 != (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                        *)0x0) && (((ulong)(pFVar9->right).unsafe_capptr & 1) != 0)) {
          pFVar4 = (&pFVar9->left)[bVar5].unsafe_capptr;
          (&(k.unsafe_capptr)->left)[bVar5].unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)((ulong)(uVar7 & 1) |
                  (ulong)(&pFVar9->left)[bVar10].unsafe_capptr & 0xfffffffffffffffe);
          (&(CVar11.unsafe_capptr)->left)[bVar10].unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)((ulong)((uint)(&(CVar11.unsafe_capptr)->left)[bVar10].unsafe_capptr & 1) |
                  (ulong)pFVar4 & 0xfffffffffffffffe);
          (&pFVar9->left)[bVar10].unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)((ulong)((uint)(&pFVar9->left)[bVar10].unsafe_capptr & 1) | (ulong)k.unsafe_capptr
                  );
          (&pFVar9->left)[bVar5].unsafe_capptr =
               (ulong)((uint)(&pFVar9->left)[bVar5].unsafe_capptr & 1) | CVar11.unsafe_capptr;
          puVar1 = (pRVar6->node).ptr.val;
          *puVar1 = (ulong)((uint)*puVar1 & 1) | (ulong)pFVar9;
          bVar10 = (byte)*(undefined4 *)&((k.unsafe_capptr)->right).unsafe_capptr;
          CVar11.unsafe_capptr = pFVar9;
          goto LAB_00105711;
        }
        pFVar9 = ((k.unsafe_capptr)->right).unsafe_capptr;
        if (((ulong)pFVar9 & 1) != 0) {
          ((k.unsafe_capptr)->right).unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)((ulong)pFVar9 & 0xfffffffffffffffe);
          BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          ::set_red(CVar11,true);
          return true;
        }
        BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
        ::set_red(CVar11,true);
        path->length = path->length - 1;
      }
      else {
        bVar10 = bVar5 ^ 1;
        (&(k.unsafe_capptr)->left)[bVar5].unsafe_capptr =
             (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)((ulong)(uVar7 & 1) |
                (ulong)(&(CVar11.unsafe_capptr)->left)[bVar10].unsafe_capptr & 0xfffffffffffffffe);
        (&(CVar11.unsafe_capptr)->left)[bVar10].unsafe_capptr =
             (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)((ulong)((uint)(&(CVar11.unsafe_capptr)->left)[bVar10].unsafe_capptr & 1) |
                (ulong)k.unsafe_capptr);
        BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
        ::set_red(k,true);
        pFVar9 = ((CVar11.unsafe_capptr)->right).unsafe_capptr;
        if (((ulong)pFVar9 & 1) != 0) {
          ((CVar11.unsafe_capptr)->right).unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)((ulong)pFVar9 & 0xfffffffffffffffe);
        }
        sVar2 = path->length;
        puVar1 = (path->path)._M_elems[sVar2 - 2].node.ptr.val;
        *puVar1 = (ulong)((uint)*puVar1 & 1) | (ulong)CVar11.unsafe_capptr;
        path->length = sVar2 - 1;
        RBPath::move(path,bVar5);
        RBPath::move_inc_null(path,bVar5);
      }
    }
  }
  return true;
}

Assistant:

bool remove_path(RBPath& path)
    {
      ChildRef splice = path.curr();
      SNMALLOC_ASSERT(!(splice.is_null()));

      debug_log("Removing", path);

      /*
       * Find immediately smaller leaf element (rightmost descendant of left
       * child) to serve as the replacement for this node.  We may not have a
       * left subtree, so this may not move the path at all.
       */
      path.move(true);
      while (path.move(false))
      {}

      K curr = path.curr();

      {
        // Locally extract right-child-less replacement, replacing it with its
        // left child, if any
        K child = get_dir(true, path.curr());
        // Unlink target replacing with possible child.
        path.curr() = child;
      }

      bool leaf_red = Rep::is_red(curr);

      if (path.curr() != splice)
      {
        // If we had a left child, replace ourselves with the extracted value
        // from above
        Rep::set_red(curr, Rep::is_red(splice));
        get_dir(true, curr) = K{get_dir(true, splice)};
        get_dir(false, curr) = K{get_dir(false, splice)};
        splice = curr;
        path.fixup();
      }

      debug_log("Splice done", path);

      // TODO: Clear node contents?

      // Red leaf removal requires no rebalancing.
      if (leaf_red)
        return true;

      // Now in the double black case.
      // End of path is considered double black, that is, one black element
      // shorter than satisfies the invariant. The following algorithm moves up
      // the path until it finds a close red element or the root. If we convert
      // the tree to one, in which the root is double black, then the algorithm
      // is complete, as there is nothing to be out of balance with. Otherwise,
      // we are searching for nearby red elements so we can rotate the tree to
      // rebalance. The following slides nicely cover the case analysis below
      //   https://www.cs.purdue.edu/homes/ayg/CS251/slides/chap13c.pdf
      while (path.curr() != ChildRef(H{&root}))
      {
        K parent = path.parent();
        bool cur_dir = path.curr_dir();
        K sibling = get_dir(!cur_dir, parent);

        /* Handle red sibling case.
         * This performs a rotation to give a black sibling.
         *
         *         p                           s(b)
         *        / \                         /   \
         *       c   s(r)        -->         p(r)  m
         *          /  \                    / \
         *         n    m                  c   n
         *
         * By invariant we know that p, n and m are all initially black.
         */
        if (Rep::is_red(sibling))
        {
          debug_log("Red sibling", path, path.parent());
          K nibling = get_dir(cur_dir, sibling);
          get_dir(!cur_dir, parent) = nibling;
          get_dir(cur_dir, sibling) = parent;
          Rep::set_red(parent, true);
          Rep::set_red(sibling, false);
          path.parent() = sibling;
          // Manually fix path.  Using path.fixup would alter the complexity
          // class.
          path.pop();
          path.move(cur_dir);
          path.move_inc_null(cur_dir);
          path.fixup(false);
          debug_log("Red sibling - done", path, path.parent());
          continue;
        }

        /* Handle red nibling case 1.
         *          <p>                  <s>
         *          / \                  / \
         *         c   s         -->    p   rn
         *            / \              / \
         *          on   rn           c   on
         */
        if (Rep::is_red(get_dir(!cur_dir, sibling)))
        {
          debug_log("Red nibling 1", path, path.parent());
          K r_nibling = get_dir(!cur_dir, sibling);
          K o_nibling = get_dir(cur_dir, sibling);
          get_dir(cur_dir, sibling) = parent;
          get_dir(!cur_dir, parent) = o_nibling;
          path.parent() = sibling;
          Rep::set_red(r_nibling, false);
          Rep::set_red(sibling, Rep::is_red(parent));
          Rep::set_red(parent, false);
          debug_log("Red nibling 1 - done", path, path.parent());
          break;
        }

        /* Handle red nibling case 2.
         *         <p>                   <rn>
         *         / \                  /    \
         *        c   s         -->    p      s
         *           / \              / \    / \
         *         rn   on           c  rno rns on
         *         / \
         *       rno  rns
         */
        if (Rep::is_red(get_dir(cur_dir, sibling)))
        {
          debug_log("Red nibling 2", path, path.parent());
          K r_nibling = get_dir(cur_dir, sibling);
          K r_nibling_same = get_dir(cur_dir, r_nibling);
          K r_nibling_opp = get_dir(!cur_dir, r_nibling);
          get_dir(!cur_dir, parent) = r_nibling_same;
          get_dir(cur_dir, sibling) = r_nibling_opp;
          get_dir(cur_dir, r_nibling) = parent;
          get_dir(!cur_dir, r_nibling) = sibling;
          path.parent() = r_nibling;
          Rep::set_red(r_nibling, Rep::is_red(parent));
          Rep::set_red(parent, false);
          debug_log("Red nibling 2 - done", path, path.parent());
          break;
        }

        // Handle black sibling and niblings, and red parent.
        if (Rep::is_red(parent))
        {
          debug_log("Black sibling and red parent case", path, path.parent());
          Rep::set_red(parent, false);
          Rep::set_red(sibling, true);
          debug_log(
            "Black sibling and red parent case - done", path, path.parent());
          break;
        }
        // Handle black sibling and niblings and black parent.
        debug_log(
          "Black sibling, niblings and black parent case", path, path.parent());
        Rep::set_red(sibling, true);
        path.pop();
        invariant(path.curr());
        debug_log(
          "Black sibling, niblings and black parent case - done",
          path,
          path.curr());
      }
      return true;
    }